

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void Encoder::EnsureRelocEntryIntegrity
               (size_t newBufferStartAddress,size_t codeSize,size_t oldBufferAddress,
               size_t relocAddress,uint offsetBytes,ptrdiff_t opndData,bool isRelativeAddr)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  undefined4 *puVar5;
  long lVar4;
  
  if (relocAddress < oldBufferAddress || oldBufferAddress + codeSize <= relocAddress) {
    uVar3 = *(ulong *)relocAddress;
  }
  else {
    lVar4 = 0;
    if (isRelativeAddr) {
      lVar4 = (newBufferStartAddress - oldBufferAddress) + relocAddress + (ulong)offsetBytes;
    }
    uVar3 = lVar4 + opndData;
  }
  if ((newBufferStartAddress <= uVar3) && (uVar3 < codeSize + newBufferStartAddress)) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar5 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                     ,0x474,"(false)","false");
  if (bVar2) {
    *puVar5 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void Encoder::EnsureRelocEntryIntegrity(size_t newBufferStartAddress, size_t codeSize, size_t oldBufferAddress, size_t relocAddress, uint offsetBytes, ptrdiff_t opndData, bool isRelativeAddr)
{
    size_t targetBrAddress = 0;
    size_t newBufferEndAddress = newBufferStartAddress + codeSize;

    //Handle Dictionary addresses here - The target address will be in the dictionary.
    if (relocAddress < oldBufferAddress || relocAddress >= (oldBufferAddress + codeSize))
    {
        targetBrAddress = (size_t)(*(size_t*)relocAddress);
    }
    else
    {
        size_t newBufferRelocAddr = relocAddress - oldBufferAddress + newBufferStartAddress;

        if (isRelativeAddr)
        {
            targetBrAddress = (size_t)newBufferRelocAddr + offsetBytes + opndData;
        }
        else  // Absolute Address
        {
            targetBrAddress = (size_t)opndData;
        }
    }

    if (targetBrAddress < newBufferStartAddress || targetBrAddress >= newBufferEndAddress)
    {
        Assert(false);
        Fatal();
    }
}